

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_cfg.cpp
# Opt level: O2

void mpp_enc_cfg_show(void)

{
  MppTrieInfo *pMVar1;
  MppTrieInfo MVar2;
  MppEncCfgService *this;
  MppTrieInfo *node_00;
  char *pcVar3;
  uint uVar4;
  MppTrieInfo *node;
  
  this = MppEncCfgService::get();
  node_00 = MppEncCfgService::get_info_first(this);
  _mpp_log_l(4,"mpp_enc_cfg","dumping valid configure string start\n",(char *)0x0);
  for (; node_00 != (MppTrieInfo *)0x0; node_00 = MppEncCfgService::get_info_next(this,node_00)) {
    MVar2 = *node_00;
    pMVar1 = node_00 + 1;
    if (((uint)MVar2 & 0xfff000) == 0x14000) {
      uVar4 = (uint)MVar2 >> 0x18;
      pcVar3 = strof_cfg_type(*(CfgType *)(&pMVar1->field_0x0 + uVar4));
      _mpp_log_l(4,"mpp_enc_cfg","%-25s type %s - %d:%d\n",(char *)0x0,pMVar1,pcVar3,
                 (ulong)*(uint *)(&node_00[4].field_0x0 + uVar4),
                 (ulong)*(uint *)(&node_00[5].field_0x0 + uVar4));
    }
    else {
      _mpp_log_l(4,"mpp_enc_cfg","%-25s size - %d\n",(char *)0x0,pMVar1,
                 (ulong)((uint)MVar2 >> 0xc & 0xfff));
    }
  }
  _mpp_log_l(4,"mpp_enc_cfg","dumping valid configure string done\n",(char *)0x0);
  _mpp_log_l(4,"mpp_enc_cfg","total cfg count %d with %d node size %d\n",(char *)0x0,
             (ulong)(uint)(this->mHead).info_count,(ulong)(uint)(this->mHead).node_count,
             (ulong)(uint)(this->mHead).info_size);
  return;
}

Assistant:

void mpp_enc_cfg_show(void)
{
    MppEncCfgService *srv = MppEncCfgService::get();
    MppTrieInfo *root = srv->get_info_first();

    mpp_log("dumping valid configure string start\n");

    if (root) {
        MppTrieInfo *node = root;

        do {
            if (node->ctx_len == sizeof(MppCfgInfo)) {
                MppCfgInfo *info = (MppCfgInfo *)mpp_trie_info_ctx(node);

                mpp_log("%-25s type %s - %d:%d\n", mpp_trie_info_name(node),
                        strof_cfg_type(info->data_type), info->data_offset, info->data_size);
            } else {
                mpp_log("%-25s size - %d\n", mpp_trie_info_name(node), node->ctx_len);
            }

            node = srv->get_info_next(node);
            if (!node)
                break;
        } while (1);
    }
    mpp_log("dumping valid configure string done\n");

    mpp_log("total cfg count %d with %d node size %d\n",
            srv->get_info_count(), srv->get_node_count(), srv->get_info_size());
}